

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O2

_Bool arm_generate_debug_exceptions(CPUARMState_conflict *env)

{
  _Bool _Var1;
  int iVar2;
  bool bVar3;
  
  if ((env->aarch64 == 0) &&
     ((iVar2 = arm_current_el(env), iVar2 != 0 || (_Var1 = arm_el_is_aa64(env,1), !_Var1)))) {
    _Var1 = arm_is_secure(env);
    if (_Var1) {
      if ((iVar2 == 0) && (((env->cp15).sder & 1) != 0)) {
        return true;
      }
      bVar3 = ((env->cp15).mdcr_el3 & 0xc000) == 0x8000;
    }
    else {
      bVar3 = iVar2 == 2;
    }
    return !bVar3;
  }
  _Var1 = aa64_generate_debug_exceptions(env);
  return _Var1;
}

Assistant:

static inline bool arm_generate_debug_exceptions(CPUARMState *env)
{
    if (env->aarch64) {
        return aa64_generate_debug_exceptions(env);
    } else {
        return aa32_generate_debug_exceptions(env);
    }
}